

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

String __thiscall testing::internal::FormatForFailureMessage(internal *this,char ch)

{
  size_t extraout_RDX;
  String SVar2;
  char *local_68;
  bool local_29;
  String local_28;
  uint local_18;
  char local_11;
  uint ch_as_uint;
  char ch_local;
  size_t sVar1;
  
  local_18 = (uint)ch;
  local_11 = ch;
  _ch_as_uint = this;
  if (ch == '\0') {
    local_68 = "\\0";
  }
  else {
    String::Format(&local_28,"%c",(ulong)(uint)(int)ch);
    local_68 = String::c_str(&local_28);
  }
  local_29 = ch != '\0';
  SVar2 = String::Format((String *)this,"\'%s\' (%u, 0x%X)",local_68,(ulong)local_18);
  sVar1 = SVar2.length_;
  if (local_29) {
    String::~String(&local_28);
    sVar1 = extraout_RDX;
  }
  SVar2.length_ = sVar1;
  SVar2.c_str_ = (char *)this;
  return SVar2;
}

Assistant:

String FormatForFailureMessage(char ch) {
  const unsigned int ch_as_uint = ch;
  // A String object cannot contain '\0', so we print "\\0" when ch is
  // '\0'.
  return String::Format("'%s' (%u, 0x%X)",
                        ch ? String::Format("%c", ch).c_str() : "\\0",
                        ch_as_uint, ch_as_uint);
}